

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
          (list_caster<std::vector<float,_std::allocator<float>_>,_float> *this,handle src,
          bool convert)

{
  bool bVar1;
  handle src_00;
  template_cast_op_type<float> __x;
  handle it;
  undefined1 local_98 [8];
  iterator __end3;
  iterator __begin3;
  sequence *__range3;
  sequence local_50;
  type_caster<float,_void> local_44;
  handle hStack_40;
  value_conv conv;
  sequence local_38;
  sequence s;
  bool convert_local;
  list_caster<std::vector<float,_std::allocator<float>_>,_float> *this_local;
  handle src_local;
  
  s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::sequence,_0>(src);
  if (bVar1) {
    hStack_40.m_ptr = src.m_ptr;
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_38,src);
    std::vector<float,_std::allocator<float>_>::clear(&this->value);
    sequence::sequence(&local_50,&local_38);
    reserve_maybe<std::vector<float,_std::allocator<float>_>,_0>(this,&local_50,&this->value);
    sequence::~sequence(&local_50);
    object_api<pybind11::handle>::begin
              ((iterator *)&__end3.ready,(object_api<pybind11::handle> *)&local_38);
    object_api<pybind11::handle>::end
              ((iterator *)local_98,(object_api<pybind11::handle> *)&local_38);
    while (bVar1 = iterator::operator!=((iterator *)&__end3.ready,(iterator *)local_98), bVar1) {
      src_00 = iterator::operator*((iterator *)&__end3.ready);
      bVar1 = type_caster<float,_void>::load(&local_44,src_00,convert);
      if (!bVar1) {
        src_local.m_ptr._7_1_ = 0;
        it.m_ptr._4_4_ = 1;
        goto LAB_00189b32;
      }
      __x = cast_op<float>(&local_44);
      std::vector<float,_std::allocator<float>_>::push_back(&this->value,__x);
      iterator::operator++((iterator *)&__end3.ready);
    }
    it.m_ptr._4_4_ = 2;
LAB_00189b32:
    iterator::~iterator((iterator *)local_98);
    iterator::~iterator((iterator *)&__end3.ready);
    if (it.m_ptr._4_4_ == 2) {
      src_local.m_ptr._7_1_ = 1;
    }
    sequence::~sequence(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value_conv conv;
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value>(conv));
        }
        return true;
    }